

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExprWriter.cpp
# Opt level: O0

void __thiscall ExprWriter::visit(ExprWriter *this,StackAlloc *expr)

{
  ostream *poVar1;
  long *plVar2;
  long *in_RSI;
  long in_RDI;
  string local_60 [48];
  string local_30 [32];
  long *local_10;
  
  poVar1 = *(ostream **)(in_RDI + 8);
  local_10 = in_RSI;
  plVar2 = (long *)(**(code **)(*in_RSI + 0x20))();
  (**(code **)(*plVar2 + 0x18))();
  std::operator<<(poVar1,local_30);
  std::__cxx11::string::~string(local_30);
  std::operator<<(*(ostream **)(in_RDI + 8)," ");
  poVar1 = *(ostream **)(in_RDI + 8);
  plVar2 = (long *)(**(code **)(*local_10 + 0x20))();
  (**(code **)(*plVar2 + 0x20))(local_60,plVar2,local_10[3] + 0x18);
  std::operator<<(poVar1,local_60);
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

void ExprWriter::visit(StackAlloc& expr) {
    ss << expr.getType()->toString();
    ss << " ";
    ss << expr.getType()->surroundName(expr.value->valueName);
}